

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall Lexer::token(Lexer *this,string *token,Type *type)

{
  Type *type_00;
  Type *token_00;
  bool bVar1;
  char *pcVar2;
  bool local_82;
  allocator<char> local_49;
  string local_48;
  Type *local_28;
  Type *type_local;
  string *token_local;
  Lexer *this_local;
  
  local_28 = type;
  type_local = (Type *)token;
  token_local = &this->_text;
  while( true ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
    bVar1 = unicodeWhitespace((int)*pcVar2);
    if (!bVar1) break;
    utf8_next_char(&this->_text,&this->_cursor);
  }
  bVar1 = isEOS(this);
  token_00 = type_local;
  type_00 = local_28;
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\'\"",&local_49);
    bVar1 = isString(this,(string *)token_00,type_00,&local_48);
    local_82 = true;
    if (!bVar1) {
      bVar1 = isUUID(this,(string *)type_local,local_28,true);
      local_82 = true;
      if (!bVar1) {
        bVar1 = isDate(this,(string *)type_local,local_28);
        local_82 = true;
        if (!bVar1) {
          bVar1 = isDuration(this,(string *)type_local,local_28);
          local_82 = true;
          if (!bVar1) {
            bVar1 = isURL(this,(string *)type_local,local_28);
            local_82 = true;
            if (!bVar1) {
              bVar1 = isHexNumber(this,(string *)type_local,local_28);
              local_82 = true;
              if (!bVar1) {
                bVar1 = isNumber(this,(string *)type_local,local_28);
                local_82 = true;
                if (!bVar1) {
                  bVar1 = isPath(this,(string *)type_local,local_28);
                  local_82 = true;
                  if (!bVar1) {
                    bVar1 = isPattern(this,(string *)type_local,local_28);
                    local_82 = true;
                    if (!bVar1) {
                      bVar1 = isOperator(this,(string *)type_local,local_28);
                      local_82 = true;
                      if (!bVar1) {
                        local_82 = isWord(this,(string *)type_local,local_28);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (local_82 == false) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Lexer::token (std::string& token, Lexer::Type& type)
{
  // Eat white space.
  while (unicodeWhitespace (_text[_cursor]))
    utf8_next_char (_text, _cursor);

  // Terminate at EOS.
  if (isEOS ())
    return false;

  if (isString    (token, type, "'\"") ||
      isUUID      (token, type, true)  ||
      isDate      (token, type)        ||
      isDuration  (token, type)        ||
      isURL       (token, type)        ||
      isHexNumber (token, type)        ||
      isNumber    (token, type)        ||
      isPath      (token, type)        ||
      isPattern   (token, type)        ||
      isOperator  (token, type)        ||
      isWord      (token, type))
    return true;

  return false;
}